

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void __thiscall icu_63::NFRule::_appendRuleText(NFRule *this,UnicodeString *result)

{
  int64_t n;
  NFSubstitution *pNVar1;
  undefined4 uVar2;
  char16_t cVar3;
  int16_t iVar4;
  int iVar5;
  UnicodeString *pUVar6;
  char16_t srcChar;
  int iVar7;
  ConstChar16Ptr local_f0;
  ConstChar16Ptr local_e8;
  ConstChar16Ptr local_e0;
  char16_t *local_d8;
  char16_t *local_c8;
  char16_t *local_b8;
  UnicodeString temp;
  UnicodeString ruleTextCopy;
  
  n = this->baseValue;
  uVar2 = 0xfffffff9;
  if (n < 1) {
    uVar2 = (undefined4)n;
  }
  switch(uVar2) {
  case 0xfffffffa:
    local_f0.p_ = L"NaN";
    UnicodeString::append(result,&local_f0,3);
    local_b8 = local_f0.p_;
    break;
  case 0xfffffffb:
    local_e8.p_ = L"Inf";
    UnicodeString::append(result,&local_e8,3);
    local_c8 = local_e8.p_;
    break;
  case 0xfffffffc:
    pUVar6 = UnicodeString::append(result,L'x');
    cVar3 = L'.';
    if (this->decimalPoint != L'\0') {
      cVar3 = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,cVar3);
    cVar3 = L'0';
    goto LAB_00248dd3;
  case 0xfffffffd:
    pUVar6 = UnicodeString::append(result,L'0');
    cVar3 = L'.';
    if (this->decimalPoint != L'\0') {
      cVar3 = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,cVar3);
    cVar3 = L'x';
    goto LAB_00248dd3;
  case 0xfffffffe:
    cVar3 = L'x';
    pUVar6 = UnicodeString::append(result,L'x');
    srcChar = L'.';
    if (this->decimalPoint != L'\0') {
      srcChar = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,srcChar);
LAB_00248dd3:
    UnicodeString::append(pUVar6,cVar3);
    break;
  case 0xffffffff:
    local_e0.p_ = L"-x";
    UnicodeString::append(result,&local_e0,2);
    local_d8 = local_e0.p_;
    break;
  default:
    util_append64(result,n);
    if (this->radix != 10) {
      UnicodeString::append(result,L'/');
      util_append64(result,(long)this->radix);
    }
    iVar4 = expectedExponent(this);
    iVar5 = (int)iVar4 - (int)this->exponent;
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    while (iVar7 != 0) {
      UnicodeString::append(result,L'>');
      iVar7 = iVar7 + -1;
    }
  }
  UnicodeString::append(result,L':');
  UnicodeString::append(result,L' ');
  cVar3 = UnicodeString::doCharAt(&this->fRuleText,0);
  if ((cVar3 == L' ') && ((this->sub1 == (NFSubstitution *)0x0 || (this->sub1->pos != 0)))) {
    UnicodeString::append(result,L'\'');
  }
  ruleTextCopy.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268
  ;
  ruleTextCopy.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setTo(&ruleTextCopy,&this->fRuleText);
  temp.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  temp.fUnion.fStackFields.fLengthAndFlags = 2;
  pNVar1 = this->sub2;
  if (pNVar1 != (NFSubstitution *)0x0) {
    (*(pNVar1->super_UObject)._vptr_UObject[5])(pNVar1,&temp);
    UnicodeString::insert(&ruleTextCopy,this->sub2->pos,&temp);
  }
  pNVar1 = this->sub1;
  if (pNVar1 != (NFSubstitution *)0x0) {
    (*(pNVar1->super_UObject)._vptr_UObject[5])(pNVar1,&temp);
    UnicodeString::insert(&ruleTextCopy,this->sub1->pos,&temp);
  }
  UnicodeString::append(result,&ruleTextCopy);
  UnicodeString::append(result,L';');
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::~UnicodeString(&ruleTextCopy);
  return;
}

Assistant:

void
NFRule::_appendRuleText(UnicodeString& result) const
{
    switch (getType()) {
    case kNegativeNumberRule: result.append(gMinusX, 2); break;
    case kImproperFractionRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kProperFractionRule: result.append(gZero).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kMasterRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gZero); break;
    case kInfinityRule: result.append(gInf, 3); break;
    case kNaNRule: result.append(gNaN, 3); break;
    default:
        // for a normal rule, write out its base value, and if the radix is
        // something other than 10, write out the radix (with the preceding
        // slash, of course).  Then calculate the expected exponent and if
        // if isn't the same as the actual exponent, write an appropriate
        // number of > signs.  Finally, terminate the whole thing with
        // a colon.
        util_append64(result, baseValue);
        if (radix != 10) {
            result.append(gSlash);
            util_append64(result, radix);
        }
        int numCarets = expectedExponent() - exponent;
        for (int i = 0; i < numCarets; i++) {
            result.append(gGreaterThan);
        }
        break;
    }
    result.append(gColon);
    result.append(gSpace);

    // if the rule text begins with a space, write an apostrophe
    // (whitespace after the rule descriptor is ignored; the
    // apostrophe is used to make the whitespace significant)
    if (fRuleText.charAt(0) == gSpace && (sub1 == NULL || sub1->getPos() != 0)) {
        result.append(gTick);
    }

    // now, write the rule's rule text, inserting appropriate
    // substitution tokens in the appropriate places
    UnicodeString ruleTextCopy;
    ruleTextCopy.setTo(fRuleText);

    UnicodeString temp;
    if (sub2 != NULL) {
        sub2->toString(temp);
        ruleTextCopy.insert(sub2->getPos(), temp);
    }
    if (sub1 != NULL) {
        sub1->toString(temp);
        ruleTextCopy.insert(sub1->getPos(), temp);
    }

    result.append(ruleTextCopy);

    // and finally, top the whole thing off with a semicolon and
    // return the result
    result.append(gSemicolon);
}